

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remove_if.hpp
# Opt level: O2

void __thiscall
ranges::
remove_if_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/Ethiraric[P]cpptalksindex/src/TalksDB.cpp:24:10)>,_ranges::logical_negate<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/Ethiraric[P]cpptalksindex/src/TalksDB.cpp:34:10)>_>
::satisfy_forward(remove_if_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:34:10)>_>
                  *this,iterator_t<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>
                        *it)

{
  __normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>
  _Var1;
  anon_union_8_2_3153383c_for_semiregular_box<ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:34:10)>_>_2
  aVar2;
  enable_if_t<detail::facade_sentinel_t<remove_if_view<ref_view<const_vector<reference_wrapper<const_TalkRef>,_allocator<reference_wrapper<const_TalkRef>_>_>_>,_logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>_>,_static_cast<bool>(same_as<ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>_>)____CPP_false(::concepts::detail::xNil__)>
  eVar3;
  
  eVar3 = _end_::fn::operator()
                    ((fn *)&(this->
                            super_view_adaptor<ranges::remove_if_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:34:10)>_>,_ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>,_(ranges::cardinality)_1>
                            ).rng_);
  while (((_Var1._M_current =
                *(reference_wrapper<const_cppti::TalksDB::TalkRef> **)
                 &(it->
                  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>::adaptor>_>
                  ).
                  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>::adaptor>,_void>
                  .
                  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>::adaptor>_>
                  .
                  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>::adaptor>_>
                  .
                  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>::adaptor>,_void,_(ranges::detail::box_compress)0>
                  .value.
                  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>::adaptor,_1>
          , _Var1._M_current !=
            (reference_wrapper<const_cppti::TalksDB::TalkRef> *)
            eVar3.
            super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>::adaptor>_>
            .
            super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>::adaptor>,_void>
            .
            super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>::adaptor>_>
            .
            super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>::adaptor>_>
            .
            super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>::adaptor>,_void,_(ranges::detail::box_compress)0>
            .value.
            super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>::adaptor,_1>
            .data_.
            super_box<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
            .value._M_current &&
          (aVar2 = (this->
                   super_box<ranges::semiregular_box<ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:34:10)>_>,_void,_(ranges::detail::box_compress)0>
                   ).value.field_0,
          aVar2 != (anon_union_8_2_3153383c_for_semiregular_box<ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:34:10)>_>_2
                    )0x0)) &&
         ((anon_union_8_2_3153383c_for_semiregular_box<ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:34:10)>_>_2
           )(_Var1._M_current)->_M_data->year != aVar2))) {
    basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<std::reference_wrapper<cppti::TalksDB::TalkRef_const>const*,std::vector<std::reference_wrapper<cppti::TalksDB::TalkRef_const>,std::allocator<std::reference_wrapper<cppti::TalksDB::TalkRef_const>>>>,ranges::remove_if_view<ranges::ref_view<std::vector<std::reference_wrapper<cppti::TalksDB::TalkRef_const>,std::allocator<std::reference_wrapper<cppti::TalksDB::TalkRef_const>>>const>,ranges::logical_negate<cppti::(anonymous_namespace)::getTagsFilter(gsl::span<std::basic_string_view<char,std::char_traits<char>>const,-1l>)::$_0>>::adaptor>>
    ::operator++((basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<std::reference_wrapper<cppti::TalksDB::TalkRef_const>const*,std::vector<std::reference_wrapper<cppti::TalksDB::TalkRef_const>,std::allocator<std::reference_wrapper<cppti::TalksDB::TalkRef_const>>>>,ranges::remove_if_view<ranges::ref_view<std::vector<std::reference_wrapper<cppti::TalksDB::TalkRef_const>,std::allocator<std::reference_wrapper<cppti::TalksDB::TalkRef_const>>>const>,ranges::logical_negate<cppti::(anonymous_namespace)::getTagsFilter(gsl::span<std::basic_string_view<char,std::char_traits<char>>const,_1l>)::__0>>::adaptor>>
                  *)it);
  }
  return;
}

Assistant:

constexpr void satisfy_forward(iterator_t<Rng> & it)
        {
            auto const last = ranges::end(this->base());
            auto & pred = this->remove_if_view::box::get();
            while(it != last && invoke(pred, *it))
                ++it;
        }